

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status filemgr_destroy_file(char *filename,filemgr_config *config,hash *destroy_file_set)

{
  filemgr_ops **e;
  ushort uVar1;
  avl_node *filename_00;
  hash *ht;
  bool bVar2;
  int iVar3;
  fdb_status fVar4;
  hash_elem *phVar5;
  __atomic_base<unsigned_long> _Var6;
  hash_elem *phVar7;
  filemgr_ops *pfVar8;
  size_t sVar9;
  filemgr_config *pfVar10;
  avl_node **__lock;
  filemgr_config local_6b8;
  filemgr local_658;
  undefined1 auStack_368 [8];
  char *local_360;
  filemgr query;
  hash to_destroy_files;
  fdb_status local_34;
  
  ht = destroy_file_set;
  if (destroy_file_set == (hash *)0x0) {
    local_658.fhandle_idx_lock = 0x12e98d;
    local_658._748_4_ = 0;
    hash_init((hash *)&query.fhandle_idx_lock,0x400,_file_hash,_file_cmp);
    ht = (hash *)&query.fhandle_idx_lock;
  }
  e = &query.ops;
  local_658.fhandle_idx_lock = 0x12e9a7;
  local_658._748_4_ = 0;
  local_360 = filename;
  phVar5 = hash_find(ht,(hash_elem *)e);
  if (phVar5 == (hash_elem *)0x0) {
    local_658.fhandle_idx_lock = 0x12e9d4;
    local_658._748_4_ = 0;
    hash_insert(ht,(hash_elem *)e);
    local_658.fhandle_idx_lock = 0x12e9e3;
    local_658._748_4_ = 0;
    phVar5 = hash_find(&hash,(hash_elem *)e);
    if (phVar5 == (hash_elem *)0x0) {
      local_6b8.do_not_cache_doc_blocks = true;
      local_6b8._89_3_ = 0x12ea;
      local_6b8.num_blocks_readahead = 0;
      memset(&local_658,0,0x2f0);
      local_6b8.do_not_cache_doc_blocks = true;
      local_6b8._89_3_ = 0x12ea;
      local_6b8.num_blocks_readahead = 0;
      local_658.filename = filename;
      local_658.ops = get_filemgr_ops();
      local_6b8.do_not_cache_doc_blocks = true;
      local_6b8._89_3_ = 0x12ea;
      local_6b8.num_blocks_readahead = 0;
      local_658.fd = (*(local_658.ops)->open)(local_658.filename,2,0x1b6);
      local_658.blocksize = global_config.blocksize;
      local_658.config = &local_6b8;
      filemgr_config::operator=(&local_6b8,config);
      fdb_init_encryptor(&local_658.encryption,&config->encryption_key);
      pfVar10 = &local_6b8;
      if (local_658.fd < FDB_RESULT_SUCCESS) {
        local_34 = FDB_RESULT_SUCCESS;
        if (local_658.fd != FDB_RESULT_NO_SUCH_FILE) {
          if (destroy_file_set != (hash *)0x0) {
            return local_658.fd;
          }
          hash_free(ht);
          return local_658.fd;
        }
      }
      else {
        _Var6._M_i = (*(local_658.ops)->goto_eof)(local_658.fd);
        if ((long)_Var6._M_i < 0) {
          if (destroy_file_set == (hash *)0x0) {
            hash_free(ht);
          }
          bVar2 = false;
          local_34 = FDB_RESULT_SUCCESS;
        }
        else {
          LOCK();
          UNLOCK();
          local_658.crc_mode = CRC32;
          local_658.pos.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var6._M_i;
          local_34 = _filemgr_load_sb(&local_658,(err_log_callback *)0x0);
          if (local_34 == FDB_RESULT_SUCCESS) {
            _Var6._M_i = 0;
            local_34 = _filemgr_read_header(&local_658,(err_log_callback *)0x0);
            if (local_34 == FDB_RESULT_SUCCESS) {
              if (local_658.header.data != (void *)0x0) {
                sVar9 = ver_get_new_filename_off(local_658.version);
                if (*(short *)((long)local_658.header.data + sVar9 + 2) == 0) {
                  _Var6._M_i = 0;
                }
                else {
                  uVar1 = *(ushort *)((long)local_658.header.data + sVar9);
                  fVar4 = filemgr_destroy_file
                                    ((char *)((long)((long)local_658.header.data + sVar9) +
                                             (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) + 4),config,ht
                                    );
                  _Var6._M_i = (__int_type)(uint)fVar4;
                }
                free(local_658.header.data);
              }
              (*(local_658.ops)->close)(local_658.fd);
              if ((sb_ops.release != (_func_fdb_status_filemgr_ptr *)0x0) &&
                 (local_658.sb != (superblock *)0x0)) {
                (*sb_ops.release)(&local_658);
              }
              bVar2 = true;
              local_34 = (fdb_status)_Var6._M_i;
              if (local_34 == FDB_RESULT_SUCCESS) {
                fVar4 = filemgr_does_file_exist(filename);
                if (fVar4 == FDB_RESULT_SUCCESS) {
                  iVar3 = remove(filename);
                  local_34 = FDB_RESULT_FILE_REMOVE_FAIL;
                  if (iVar3 == 0) {
                    local_34 = FDB_RESULT_SUCCESS;
                  }
                }
                else {
                  local_34 = FDB_RESULT_SUCCESS;
                }
              }
            }
            else {
              if (destroy_file_set == (hash *)0x0) {
                hash_free(ht);
              }
              (*(local_658.ops)->close)(local_658.fd);
              if ((sb_ops.release != (_func_fdb_status_filemgr_ptr *)0x0) &&
                 (local_658.sb != (superblock *)0x0)) {
                (*sb_ops.release)(&local_658);
              }
              bVar2 = false;
              _Var6._M_i = (__int_type)(uint)local_34;
            }
          }
          else {
            _Var6._M_i = (__int_type)(uint)local_34;
            if (destroy_file_set == (hash *)0x0) {
              hash_free(ht);
            }
            (*(local_658.ops)->close)(local_658.fd);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          return (fdb_status)_Var6._M_i;
        }
      }
    }
    else {
      __lock = &phVar5[7].avl.left;
      local_658.fhandle_idx_lock = 0x12ea01;
      local_658._748_4_ = 0;
      pthread_spin_lock((pthread_spinlock_t *)__lock);
      iVar3 = *(int *)&phVar5[-10].avl.left;
      local_658.fhandle_idx_lock = 0x12ea10;
      local_658._748_4_ = 0;
      pthread_spin_unlock((pthread_spinlock_t *)__lock);
      if (iVar3 != 0) {
        local_34 = FDB_RESULT_FILE_IS_BUSY;
        goto LAB_0012e9af;
      }
      filename_00 = phVar5[1].avl.right;
      if (filename_00 != (avl_node *)0x0) {
        local_658.fhandle_idx_lock = 0x12eb35;
        local_658._748_4_ = 0;
        local_34 = filemgr_destroy_file((char *)filename_00,config,ht);
        if (local_34 != FDB_RESULT_SUCCESS) goto LAB_0012e9af;
      }
      local_658.fhandle_idx_lock = 0x12eb50;
      local_658._748_4_ = 0;
      phVar7 = hash_remove(&hash,phVar5);
      if (phVar7 == (hash_elem *)0x0) {
        local_658.fhandle_idx_lock = 0x12eb72;
        local_658._748_4_ = 0;
        fdb_assert_die("e",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,0xb4e,0,0);
      }
      local_658.fhandle_idx_lock = 0x12eb7a;
      local_658._748_4_ = 0;
      filemgr_free_func(phVar5);
      local_658.fhandle_idx_lock = 0x12eb7f;
      local_658._748_4_ = 0;
      pfVar8 = get_filemgr_ops();
      local_34 = FDB_RESULT_SUCCESS;
      local_658.fhandle_idx_lock = 0x12eb99;
      local_658._748_4_ = 0;
      iVar3 = (*pfVar8->open)(filename,0,0x124);
      pfVar10 = (filemgr_config *)auStack_368;
      if (-1 < iVar3) {
        local_658.fhandle_idx_lock = 0x12eba8;
        local_658._748_4_ = 0;
        (*pfVar8->close)(iVar3);
        local_658.fhandle_idx_lock = 0x12ebb0;
        local_658._748_4_ = 0;
        iVar3 = remove(filename);
        local_34 = FDB_RESULT_FILE_REMOVE_FAIL;
        pfVar10 = (filemgr_config *)auStack_368;
        if (iVar3 == 0) {
          local_34 = FDB_RESULT_SUCCESS;
          pfVar10 = (filemgr_config *)auStack_368;
        }
      }
    }
    if (destroy_file_set == (hash *)0x0) {
      pfVar10[-1].do_not_cache_doc_blocks = true;
      *(undefined3 *)&pfVar10[-1].field_0x59 = 0x12ed;
      pfVar10[-1].num_blocks_readahead = 0;
      hash_free(ht);
    }
  }
  else {
    local_34 = FDB_RESULT_SUCCESS;
LAB_0012e9af:
    if (destroy_file_set == (hash *)0x0) {
      local_658.fhandle_idx_lock = 0x12e9c0;
      local_658._748_4_ = 0;
      hash_free(ht);
    }
  }
  return local_34;
}

Assistant:

fdb_status filemgr_destroy_file(char *filename,
                                struct filemgr_config *config,
                                struct hash *destroy_file_set)
{
    struct filemgr *file = NULL;
    struct hash to_destroy_files;
    struct hash *destroy_set = (destroy_file_set ? destroy_file_set :
                                                  &to_destroy_files);
    struct filemgr query;
    struct hash_elem *e = NULL;
    fdb_status status = FDB_RESULT_SUCCESS;
    char *old_filename = NULL;

    if (!destroy_file_set) { // top level or non-recursive call
        hash_init(destroy_set, NBUCKET, _file_hash, _file_cmp);
    }

    query.filename = filename;
    // check whether file is already being destroyed in parent recursive call
    e = hash_find(destroy_set, &query.e);
    if (e) { // Duplicate filename found, nothing to be done in this call
        if (!destroy_file_set) { // top level or non-recursive call
            hash_free(destroy_set);
        }
        return status;
    } else {
        // Remember file. Stack value ok IFF single direction recursion
        hash_insert(destroy_set, &query.e);
    }

    // check global list of known files to see if it is already opened or not
    e = hash_find(&hash, &query.e);
    if (e) {
        // already opened (return existing structure)
        file = _get_entry(e, struct filemgr, e);

        spin_lock(&file->lock);
        if (atomic_get_uint32_t(&file->ref_count)) {
            spin_unlock(&file->lock);
            status = FDB_RESULT_FILE_IS_BUSY;
            if (!destroy_file_set) { // top level or non-recursive call
                hash_free(destroy_set);
            }
            return status;
        }
        spin_unlock(&file->lock);
        if (file->old_filename) {
            status = filemgr_destroy_file(file->old_filename, config,
                                          destroy_set);
            if (status != FDB_RESULT_SUCCESS) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return status;
            }
        }

        // Cleanup file from in-memory as well as on-disk
        e = hash_remove(&hash, &file->e);
        fdb_assert(e, e, 0);
        filemgr_free_func(&file->e);
        if (filemgr_does_file_exist(filename) == FDB_RESULT_SUCCESS) {
            if (remove(filename)) {
                status = FDB_RESULT_FILE_REMOVE_FAIL;
            }
        }
    } else { // file not in memory, read on-disk to destroy older versions..
        file = (struct filemgr *)alca(struct filemgr, 1);
        memset(file, 0x0, sizeof(struct filemgr));
        file->filename = filename;
        file->ops = get_filemgr_ops();
        file->fd = file->ops->open(file->filename, O_RDWR, 0666);
        file->blocksize = global_config.blocksize;
        file->config = (struct filemgr_config *)alca(struct filemgr_config, 1);
        *file->config = *config;
        fdb_init_encryptor(&file->encryption, &config->encryption_key);
        if (file->fd < 0) {
            if (file->fd != FDB_RESULT_NO_SUCH_FILE) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return (fdb_status) file->fd;
            }
        } else { // file successfully opened, seek to end to get DB header
            cs_off_t offset = file->ops->goto_eof(file->fd);
            if (offset < 0) {
                if (!destroy_file_set) { // top level or non-recursive call
                    hash_free(destroy_set);
                }
                return (fdb_status) offset;
            } else { // Need to read DB header which contains old filename
                atomic_store_uint64_t(&file->pos, offset);
                // initialize CRC mode
                if (file->config && file->config->options & FILEMGR_CREATE_CRC32) {
                    file->crc_mode = CRC32;
                } else {
                    file->crc_mode = CRC_DEFAULT;
                }

                status = _filemgr_load_sb(file, NULL);
                if (status != FDB_RESULT_SUCCESS) {
                    if (!destroy_file_set) { // top level or non-recursive call
                        hash_free(destroy_set);
                    }
                    file->ops->close(file->fd);
                    return status;
                }

                status = _filemgr_read_header(file, NULL);
                if (status != FDB_RESULT_SUCCESS) {
                    if (!destroy_file_set) { // top level or non-recursive call
                        hash_free(destroy_set);
                    }
                    file->ops->close(file->fd);
                    if (sb_ops.release && file->sb) {
                        sb_ops.release(file);
                    }
                    return status;
                }
                if (file->header.data) {
                    size_t new_fnamelen_off = ver_get_new_filename_off(file->
                                                                      version);
                    size_t old_fnamelen_off = new_fnamelen_off + 2;
                    uint16_t *new_filename_len_ptr = (uint16_t *)((char *)
                                                     file->header.data
                                                     + new_fnamelen_off);
                    uint16_t new_filename_len =
                                      _endian_decode(*new_filename_len_ptr);
                    uint16_t *old_filename_len_ptr = (uint16_t *)((char *)
                                                     file->header.data
                                                     + old_fnamelen_off);
                    uint16_t old_filename_len =
                                      _endian_decode(*old_filename_len_ptr);
                    old_filename = (char *)file->header.data + old_fnamelen_off
                                   + 2 + new_filename_len;
                    if (old_filename_len) {
                        status = filemgr_destroy_file(old_filename, config,
                                                      destroy_set);
                    }
                    free(file->header.data);
                }
                file->ops->close(file->fd);
                if (sb_ops.release && file->sb) {
                    sb_ops.release(file);
                }
                if (status == FDB_RESULT_SUCCESS) {
                    if (filemgr_does_file_exist(filename)
                                               == FDB_RESULT_SUCCESS) {
                        if (remove(filename)) {
                            status = FDB_RESULT_FILE_REMOVE_FAIL;
                        }
                    }
                }
            }
        }
    }

    if (!destroy_file_set) { // top level or non-recursive call
        hash_free(destroy_set);
    }

    return status;
}